

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderInput.cpp
# Opt level: O0

void __thiscall
glcts::GeometryShader_gl_PointSize_ValueTest::deinit(GeometryShader_gl_PointSize_ValueTest *this)

{
  bool bVar1;
  int iVar2;
  ContextType type;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  Functions *gl;
  GeometryShader_gl_PointSize_ValueTest *this_local;
  long lVar4;
  
  pRVar3 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
  iVar2 = (*pRVar3->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar2);
  (**(code **)(lVar4 + 0x1680))(0);
  (**(code **)(lVar4 + 0xd8))(0);
  (**(code **)(lVar4 + 0x6a0))(0x8ca9,0x8ce0,0xde1,0);
  (**(code **)(lVar4 + 0xb8))(0xde1,0);
  (**(code **)(lVar4 + 0x78))(0x8d40,0);
  pRVar3 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
  type.super_ApiType.m_bits = (ApiType)(*pRVar3->_vptr_RenderContext[2])();
  bVar1 = glu::isContextTypeES(type);
  if (!bVar1) {
    (**(code **)(lVar4 + 0x4e8))(0x8642);
  }
  if (this->m_program_object_id != 0) {
    (**(code **)(lVar4 + 0x448))(this->m_program_object_id);
  }
  if (this->m_fragment_shader_id != 0) {
    (**(code **)(lVar4 + 0x470))(this->m_fragment_shader_id);
  }
  if (this->m_geometry_shader_id != 0) {
    (**(code **)(lVar4 + 0x470))(this->m_geometry_shader_id);
  }
  if (this->m_vertex_shader_id != 0) {
    (**(code **)(lVar4 + 0x470))(this->m_vertex_shader_id);
  }
  if (this->m_vertex_array_object_id != 0) {
    (**(code **)(lVar4 + 0x490))(1,&this->m_vertex_array_object_id);
  }
  if (this->m_color_texture_id != 0) {
    (**(code **)(lVar4 + 0x480))(1,&this->m_color_texture_id);
  }
  if (this->m_framebuffer_object_id != 0) {
    (**(code **)(lVar4 + 0x440))(1,&this->m_framebuffer_object_id);
  }
  TestCaseBase::deinit(&this->super_TestCaseBase);
  return;
}

Assistant:

void GeometryShader_gl_PointSize_ValueTest::deinit()
{
	/* GL */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Bind defaults */
	gl.useProgram(0);
	gl.bindVertexArray(0);
	gl.framebufferTexture2D(GL_DRAW_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, 0 /* texture */, 0 /* level */);
	gl.bindTexture(GL_TEXTURE_2D, 0);
	gl.bindFramebuffer(GL_FRAMEBUFFER, 0);
	if (!glu::isContextTypeES(m_context.getRenderContext().getType()))
	{
		gl.disable(GL_PROGRAM_POINT_SIZE);
	}

	/* Delete everything */
	if (m_program_object_id != 0)
	{
		gl.deleteProgram(m_program_object_id);
	}

	if (m_fragment_shader_id != 0)
	{
		gl.deleteShader(m_fragment_shader_id);
	}

	if (m_geometry_shader_id != 0)
	{
		gl.deleteShader(m_geometry_shader_id);
	}

	if (m_vertex_shader_id != 0)
	{
		gl.deleteShader(m_vertex_shader_id);
	}

	if (m_vertex_array_object_id != 0)
	{
		gl.deleteVertexArrays(1, &m_vertex_array_object_id);
	}

	if (m_color_texture_id != 0)
	{
		gl.deleteTextures(1, &m_color_texture_id);
	}

	if (m_framebuffer_object_id != 0)
	{
		gl.deleteFramebuffers(1, &m_framebuffer_object_id);
	}

	/* Release base class */
	TestCaseBase::deinit();
}